

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O3

TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> * __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::operator=
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *this,
          TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *cp)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  
  iVar1 = (cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
          super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0];
  iVar2 = (cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
          super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1];
  iVar3 = (cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
          super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3];
  (this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
  super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2] =
       (cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
       super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2];
  (this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
  super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3] = iVar3;
  (this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
  super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0] = iVar1;
  (this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
  super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1] = iVar2;
  (this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).fGeoEl =
       (cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).fGeoEl;
  lVar4 = 0x40;
  do {
    *(undefined8 *)
     ((long)(this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
            super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar4 + -0x10) =
         *(undefined8 *)
          ((long)(cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
                 super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar4 + -0x10);
    *(undefined4 *)
     ((long)(this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
            super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar4 + -8) =
         *(undefined4 *)
          ((long)(cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
                 super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar4 + -8);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xd0);
  lVar4 = 0xc0;
  do {
    TPZTransform<double>::operator=
              ((TPZTransform<double> *)
               ((long)(this->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
                      super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar4 + -8),
               (TPZTransform<double> *)
               ((long)(cp->super_TPZGeoBlend<pzgeom::TPZGeoQuad>).super_TPZGeoQuad.
                      super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes + lVar4 + -8));
    lVar4 = lVar4 + 0x1a0;
  } while (lVar4 != 0xa80);
  this->fR = cp->fR;
  TPZVec<double>::operator=(&this->fxc,&cp->fxc);
  return this;
}

Assistant:

TPZQuadSphere &operator=(const TPZQuadSphere &cp)
        {
            GeomQuad::operator=(cp);
            fR = cp.fR;
            fxc = cp.fxc;
            return *this;
        }